

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optTyped_defaultConstructorRvalue_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
::~optTyped_defaultConstructorRvalue_Test
          (optTyped_defaultConstructorRvalue_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
           *this)

{
  optTyped_defaultConstructorRvalue_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
  *this_local;
  
  ~optTyped_defaultConstructorRvalue_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TYPED_TEST(optTyped, defaultConstructorRvalue)
{
  using opt_type = typename TestFixture::type;
  auto make = [] { return opt_type{}; };
  EXPECT_FALSE(make());
  EXPECT_FALSE(make().has_value());
  EXPECT_THROW(make().value(), bad_optional_access);
  EXPECT_EQ(this->value_2, make().value_or(this->value_2));
}